

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::SerializeWithCachedSizes
          (TreeEnsembleParameters_TreeNode *this,CodedOutputStream *output)

{
  bool bVar1;
  TreeEnsembleParameters_TreeNode_TreeNodeBehavior TVar2;
  uint uVar3;
  uint64 uVar4;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *value;
  double dVar5;
  undefined4 local_20;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  TreeEnsembleParameters_TreeNode *this_local;
  
  uVar4 = treeid(this);
  if (uVar4 != 0) {
    uVar4 = treeid(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar4,output);
  }
  uVar4 = nodeid(this);
  if (uVar4 != 0) {
    uVar4 = nodeid(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,uVar4,output);
  }
  TVar2 = nodebehavior(this);
  if (TVar2 != TreeEnsembleParameters_TreeNode_TreeNodeBehavior_BranchOnValueLessThanEqual) {
    TVar2 = nodebehavior(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(3,TVar2,output);
  }
  uVar4 = branchfeatureindex(this);
  if (uVar4 != 0) {
    uVar4 = branchfeatureindex(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(10,uVar4,output);
  }
  dVar5 = branchfeaturevalue(this);
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    dVar5 = branchfeaturevalue(this);
    google::protobuf::internal::WireFormatLite::WriteDouble(0xb,dVar5,output);
  }
  uVar4 = truechildnodeid(this);
  if (uVar4 != 0) {
    uVar4 = truechildnodeid(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(0xc,uVar4,output);
  }
  uVar4 = falsechildnodeid(this);
  if (uVar4 != 0) {
    uVar4 = falsechildnodeid(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(0xd,uVar4,output);
  }
  bVar1 = missingvaluetrackstruechild(this);
  if (bVar1) {
    bVar1 = missingvaluetrackstruechild(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0xe,bVar1,output);
  }
  local_20 = 0;
  uVar3 = evaluationinfo_size(this);
  for (; local_20 < uVar3; local_20 = local_20 + 1) {
    value = evaluationinfo(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteMessage(0x14,&value->super_MessageLite,output);
  }
  dVar5 = relativehitrate(this);
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    dVar5 = relativehitrate(this);
    google::protobuf::internal::WireFormatLite::WriteDouble(0x1e,dVar5,output);
  }
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 treeId = 1;
  if (this->treeid() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->treeid(), output);
  }

  // uint64 nodeId = 2;
  if (this->nodeid() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->nodeid(), output);
  }

  // .CoreML.Specification.TreeEnsembleParameters.TreeNode.TreeNodeBehavior nodeBehavior = 3;
  if (this->nodebehavior() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      3, this->nodebehavior(), output);
  }

  // uint64 branchFeatureIndex = 10;
  if (this->branchfeatureindex() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(10, this->branchfeatureindex(), output);
  }

  // double branchFeatureValue = 11;
  if (this->branchfeaturevalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(11, this->branchfeaturevalue(), output);
  }

  // uint64 trueChildNodeId = 12;
  if (this->truechildnodeid() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(12, this->truechildnodeid(), output);
  }

  // uint64 falseChildNodeId = 13;
  if (this->falsechildnodeid() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(13, this->falsechildnodeid(), output);
  }

  // bool missingValueTracksTrueChild = 14;
  if (this->missingvaluetrackstruechild() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(14, this->missingvaluetrackstruechild(), output);
  }

  // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo evaluationInfo = 20;
  for (unsigned int i = 0, n = this->evaluationinfo_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      20, this->evaluationinfo(i), output);
  }

  // double relativeHitRate = 30;
  if (this->relativehitrate() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(30, this->relativehitrate(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.TreeEnsembleParameters.TreeNode)
}